

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub2.c
# Opt level: O1

rt_function_error_t exec_sub2_fixed16(rt_function_t *f)

{
  rt_variable_t *prVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  undefined2 uVar10;
  rt_list_t shape;
  
  equalize_bits_fixed16(*f->inputs,f->inputs[1]);
  calc_arithmetic_fixed16(f,calc_sub_fixed16);
  prVar1 = *f->outputs;
  pvVar2 = prVar1->data;
  shape._4_4_ = 0;
  shape.size = (prVar1->shape).size;
  shape.data = (prVar1->shape).data;
  uVar4 = calc_shape_size(shape);
  uVar5 = (uint)((byte)(*f->inputs)->field_0x10 >> 4);
  uVar7 = (uint)((byte)(*f->outputs)->field_0x10 >> 4);
  iVar6 = uVar5 - uVar7;
  if (iVar6 == 0 || uVar5 < uVar7) {
    if ((iVar6 < 0) && (uVar4 != 0)) {
      uVar8 = 0;
      do {
        iVar9 = (int)*(short *)((long)pvVar2 + uVar8 * 2) << (-(byte)iVar6 & 0x1f);
        iVar3 = iVar9;
        if (iVar9 < -0x7fff) {
          iVar3 = 0x8000;
        }
        uVar10 = (undefined2)iVar3;
        if (0x7ffe < iVar9) {
          uVar10 = 0x7fff;
        }
        *(undefined2 *)((long)pvVar2 + uVar8 * 2) = uVar10;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
  }
  else if (uVar4 != 0) {
    uVar8 = 0;
    do {
      *(short *)((long)pvVar2 + uVar8 * 2) =
           (short)((int)*(short *)((long)pvVar2 + uVar8 * 2) /
                  ((0x10000 << ((byte)iVar6 & 0x1f)) >> 0x10));
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_sub2_fixed16(rt_function_t *f) {
  equalize_bits_fixed16(f->inputs[0], f->inputs[1]);
  calc_arithmetic_fixed16(f, calc_sub_fixed16);
  rescale_fixed16(f->outputs[0]->data, calc_shape_size(f->outputs[0]->shape),
                  f->inputs[0]->fp_pos, f->outputs[0]->fp_pos);
  return RT_FUNCTION_ERROR_NOERROR;
}